

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::AutoReg<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____116>
          (AutoReg *this,offset_in_____C_A_T_C_H____T_E_S_T____116_to_subr method,char *className,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  MethodTestCase<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____116> *this_00;
  SourceLineInfo *in_R9;
  SourceLineInfo *lineInfo_local;
  NameAndDesc *nameAndDesc_local;
  char *className_local;
  offset_in_____C_A_T_C_H____T_E_S_T____116_to_subr method_local;
  AutoReg *this_local;
  
  this_00 = (MethodTestCase<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____116> *)
            operator_new(0x20);
  MethodTestCase<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____116>::MethodTestCase
            (this_00,method);
  registerTestCase(this,(ITestCase *)this_00,(char *)nameAndDesc,(NameAndDesc *)lineInfo,in_R9);
  return;
}

Assistant:

AutoReg(    void (C::*method)(),
                char const* className,
                NameAndDesc const& nameAndDesc,
                SourceLineInfo const& lineInfo ) {
        registerTestCase(   new MethodTestCase<C>( method ),
                            className,
                            nameAndDesc,
                            lineInfo );
    }